

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,ArrayPtr<const_char> *first,CappedArray<char,_14UL> *rest,
                 ArrayPtr<const_char> *rest_1,StringPtr *rest_2,ArrayPtr<const_char> *rest_3,
                 ArrayPtr<const_char> *rest_4)

{
  char *pcVar1;
  CappedArray<char,_14UL> *first_00;
  ArrayPtr<const_char> *rest_00;
  StringPtr *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  char *end;
  char *i;
  ArrayPtr<const_char> *rest_local_3;
  StringPtr *rest_local_2;
  ArrayPtr<const_char> *rest_local_1;
  CappedArray<char,_14UL> *rest_local;
  ArrayPtr<const_char> *first_local;
  char *target_local;
  
  end = ArrayPtr<const_char>::begin(first);
  pcVar1 = ArrayPtr<const_char>::end(first);
  first_local = (ArrayPtr<const_char> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->ptr = *end;
    end = end + 1;
    first_local = (ArrayPtr<const_char> *)((long)&first_local->ptr + 1);
  }
  first_00 = fwd<kj::CappedArray<char,14ul>>(rest);
  rest_00 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::StringPtr>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pcVar1 = fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     ((char *)first_local,first_00,rest_00,rest_1_00,rest_2_00,rest_3_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}